

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_out_scope.cpp
# Opt level: O0

void __thiscall A::A(A *this,A *other)

{
  ostream *poVar1;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  scoped_lock l;
  spin_mutex_t *in_stack_ffffffffffffffb8;
  scoped_lock *in_stack_ffffffffffffffc0;
  
  *in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + 2) = *(undefined8 *)(in_RSI + 2);
  *(undefined8 *)(in_RDI + 4) = *(undefined8 *)(in_RSI + 4);
  spin_mutex_t::scoped_lock::scoped_lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Moving ");
  poVar1 = std::operator<<(poVar1,*(char **)(in_RDI + 4));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  spin_mutex_t::scoped_lock::~scoped_lock((scoped_lock *)0x1258dd);
  *(undefined8 *)(in_RSI + 2) = 0;
  return;
}

Assistant:

A(A&& other)
  : n_(other.n_), c(other.c), name_(other.name_)
  {
    LOG("Moving " << name_);
    other.c = 0;
  }